

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void __thiscall
Gudhi::Simplex_tree<Low_options>::root_members_recursive_deletion(Simplex_tree<Low_options> *this)

{
  pointer ppVar1;
  
  if ((this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size != 0) {
    ppVar1 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    do {
      if (((ppVar1->second).children_)->parent_ == ppVar1->first) {
        rec_delete(this,(ppVar1->second).children_);
      }
      ppVar1 = ppVar1 + 1;
    } while (ppVar1 != (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start +
                       (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size);
  }
  (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  return;
}

Assistant:

void root_members_recursive_deletion() {
    for (auto sh = root_.members().begin(); sh != root_.members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    root_.members().clear();
  }